

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O1

void __thiscall TadsMessage::TadsMessage(TadsMessage *this,char *typ,OS_Event *quit_evt)

{
  OS_Counter *pOVar1;
  OS_Event *this_00;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessage_00351fe0;
  this->typ = typ;
  this->nxt = (TadsMessage *)0x0;
  this_00 = (OS_Event *)operator_new(0x88);
  OS_Event::OS_Event(this_00,0);
  this->ev = this_00;
  this->completed = 0;
  this->quit_evt = quit_evt;
  if (quit_evt != (OS_Event *)0x0) {
    LOCK();
    pOVar1 = &(quit_evt->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TadsMessage(const char *typ, OS_Event *quit_evt)
    {
        /* remember the message type */
        this->typ = typ;
        
        /* we're not in a queue yet */
        nxt = 0;

        /* set up an event to signal completion of the message */
        ev = new OS_Event(FALSE);
        completed = FALSE;

        /* remember the quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }